

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O0

void jinit_d_post_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  int in_ESI;
  long in_RDI;
  my_post_ptr post;
  
  puVar4 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x30);
  *(undefined8 **)(in_RDI + 0x238) = puVar4;
  *puVar4 = start_pass_dpost;
  puVar4[2] = 0;
  puVar4[3] = 0;
  if (*(int *)(in_RDI + 0x6c) != 0) {
    *(undefined4 *)(puVar4 + 4) = *(undefined4 *)(in_RDI + 0x19c);
    if (in_ESI == 0) {
      uVar6 = (**(code **)(*(long *)(in_RDI + 8) + 0x10))
                        (in_RDI,1,*(int *)(in_RDI + 0x88) * *(int *)(in_RDI + 0x90),
                         *(undefined4 *)(puVar4 + 4));
      puVar4[3] = uVar6;
    }
    else {
      pcVar3 = *(code **)(*(long *)(in_RDI + 8) + 0x20);
      iVar1 = *(int *)(in_RDI + 0x88);
      iVar2 = *(int *)(in_RDI + 0x90);
      uVar5 = jround_up((ulong)*(uint *)(in_RDI + 0x8c),(ulong)*(uint *)(puVar4 + 4));
      uVar6 = (*pcVar3)(in_RDI,1,0,iVar1 * iVar2,uVar5 & 0xffffffff,*(undefined4 *)(puVar4 + 4));
      puVar4[2] = uVar6;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_d_post_controller(j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_post_ptr post;

  post = (my_post_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_post_controller));
  cinfo->post = (struct jpeg_d_post_controller *)post;
  post->pub.start_pass = start_pass_dpost;
  post->whole_image = NULL;     /* flag for no virtual arrays */
  post->buffer = NULL;          /* flag for no strip buffer */

  /* Create the quantization buffer, if needed */
  if (cinfo->quantize_colors) {
    /* The buffer strip height is max_v_samp_factor, which is typically
     * an efficient number of rows for upsampling to return.
     * (In the presence of output rescaling, we might want to be smarter?)
     */
    post->strip_height = (JDIMENSION)cinfo->max_v_samp_factor;
    if (need_full_buffer) {
      /* Two-pass color quantization: need full-image storage. */
      /* We round up the number of rows to a multiple of the strip height. */
#ifdef QUANT_2PASS_SUPPORTED
      post->whole_image = (*cinfo->mem->request_virt_sarray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
         cinfo->output_width * cinfo->out_color_components,
         (JDIMENSION)jround_up((long)cinfo->output_height,
                               (long)post->strip_height),
         post->strip_height);
#else
      ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
#endif /* QUANT_2PASS_SUPPORTED */
    } else {
      /* One-pass color quantization: just make a strip buffer. */
      post->buffer = (*cinfo->mem->alloc_sarray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE,
         cinfo->output_width * cinfo->out_color_components,
         post->strip_height);
    }
  }
}